

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall Transaction_GetRoInt_Test::TestBody(Transaction_GetRoInt_Test *this)

{
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
  *this_00;
  mock_database *addr;
  Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> local_120;
  mock_mutex mutex;
  MatcherBase<bool> local_e8;
  MatcherBase<bool> local_d0;
  MatcherBase<unsigned_long> local_b8;
  undefined1 local_a0 [16];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  InvokeMethodAction<(anonymous_namespace)::mock_database,_std::shared_ptr<const_void>_((anonymous_namespace)::mock_database::*)(const_pstore::address_&,_unsigned_long,_bool,_bool)_const>
  local_28;
  
  testing::Matcher<pstore::address>::Matcher((Matcher<pstore::address> *)&mutex,(address)0x0);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_b8,4);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_d0,true);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_e8,false);
  addr = &(this->super_Transaction).db_;
  anon_unknown.dwarf_32ce0a::mock_database::gmock_get
            ((MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *)
             &transaction,addr,(Matcher<pstore::address> *)&mutex,
             (Matcher<unsigned_long> *)&local_b8,(Matcher<bool> *)&local_d0,
             (Matcher<bool> *)&local_e8);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
            InternalExpectedAt((MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
                                *)&transaction,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                               ,0x1c6,"db_",
                               "get (pstore::address::null (), sizeof (int), true, false)");
  local_28.method_ptr =
       (offset_in_mock_database_to_subr)anon_unknown.dwarf_32ce0a::mock_database::base_get;
  local_28._16_8_ = 0;
  local_28.obj_ptr = addr;
  testing::Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)>::
  Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,std::shared_ptr<void_const>((anonymous_namespace)::mock_database::*)(pstore::address_const&,unsigned_long,bool,bool)const>,void>
            ((Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)> *)
             &local_120,&local_28);
  testing::internal::
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  WillOnce(this_00,&local_120);
  std::_Function_base::~_Function_base((_Function_base *)&local_120);
  std::
  _Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
                  *)&transaction.super_transaction_base.db_);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_e8);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_d0);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_b8);
  testing::internal::MatcherBase<pstore::address>::~MatcherBase
            ((MatcherBase<pstore::address> *)&mutex);
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&local_120,&mutex);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,&addr->super_database,(unique_lock<mock_mutex> *)&local_120);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&local_120);
  pstore::database::getro<int,void>((database *)local_a0,(typed_address<int>)addr,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  pstore::transaction_base::commit(&transaction.super_transaction_base);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&transaction);
  return;
}

Assistant:

TEST_F (Transaction, GetRoInt) {
    // First setup the mock expectations.
    EXPECT_CALL (db_, get (pstore::address::null (), sizeof (int), true, false))
        .WillOnce (::testing::Invoke (&db_, &mock_database::base_get));

    // Now the real body of the test
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        db_.getro (pstore::typed_address<int>::null (), 1);
        transaction.commit ();
    }
}